

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::CheckHeaderInfo(Segment *this)

{
  bool bVar1;
  uint32_t uVar2;
  SeekHead *this_00;
  uint64_t uVar3;
  Track *pTVar4;
  long in_RDI;
  Track *track_1;
  Track *track;
  uint32_t i;
  undefined4 in_stack_ffffffffffffffc0;
  Segment *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  uint uVar5;
  uint index;
  
  if ((*(byte *)(in_RDI + 0x141) & 1) == 0) {
    bVar1 = WriteSegmentHeader((Segment *)
                               CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (!bVar1) {
      return false;
    }
    this_00 = (SeekHead *)(in_RDI + 0x20);
    uVar3 = MaxOffset(in_stack_ffffffffffffffd8);
    bVar1 = SeekHead::AddSeekEntry(this_00,0x1f43b675,uVar3);
    if (!bVar1) {
      return false;
    }
    if (((*(byte *)(in_RDI + 0x94d) & 1) != 0) && (*(long *)(in_RDI + 0x120) == 0)) {
      uVar5 = 0;
      while (index = uVar5, uVar2 = Tracks::track_entries_size((Tracks *)(in_RDI + 0x98)),
            uVar5 < uVar2) {
        pTVar4 = Tracks::GetTrackByIndex((Tracks *)(in_RDI + 0x98),index);
        if (pTVar4 == (Track *)0x0) {
          return false;
        }
        Track::number(pTVar4);
        bVar1 = Tracks::TrackIsVideo((Tracks *)this_00,CONCAT44(uVar5,in_stack_ffffffffffffffc0));
        if (bVar1) {
          uVar3 = Track::number(pTVar4);
          *(uint64_t *)(in_RDI + 0x120) = uVar3;
          break;
        }
        uVar5 = index + 1;
      }
      if (*(long *)(in_RDI + 0x120) == 0) {
        pTVar4 = Tracks::GetTrackByIndex((Tracks *)(in_RDI + 0x98),0);
        if (pTVar4 == (Track *)0x0) {
          return false;
        }
        uVar3 = Track::number(pTVar4);
        *(uint64_t *)(in_RDI + 0x120) = uVar3;
      }
    }
  }
  return true;
}

Assistant:

bool Segment::CheckHeaderInfo() {
  if (!header_written_) {
    if (!WriteSegmentHeader())
      return false;

    if (!seek_head_.AddSeekEntry(libwebm::kMkvCluster, MaxOffset()))
      return false;

    if (output_cues_ && cues_track_ == 0) {
      // Check for a video track
      for (uint32_t i = 0; i < tracks_.track_entries_size(); ++i) {
        const Track* const track = tracks_.GetTrackByIndex(i);
        if (!track)
          return false;

        if (tracks_.TrackIsVideo(track->number())) {
          cues_track_ = track->number();
          break;
        }
      }

      // Set first track found
      if (cues_track_ == 0) {
        const Track* const track = tracks_.GetTrackByIndex(0);
        if (!track)
          return false;

        cues_track_ = track->number();
      }
    }
  }
  return true;
}